

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3Getint(char **pz)

{
  bool bVar1;
  int i;
  char *z;
  char **pz_local;
  
  i = 0;
  z = *pz;
  while( true ) {
    bVar1 = false;
    if ('/' < *z) {
      bVar1 = *z < ':';
    }
    if (!bVar1) break;
    i = i * 10 + (int)*z + -0x30;
    z = z + 1;
  }
  *pz = z;
  return i;
}

Assistant:

static int fts3Getint(const char **pz){
  const char *z = *pz;
  int i = 0;
  while( (*z)>='0' && (*z)<='9' ) i = 10*i + *(z++) - '0';
  *pz = z;
  return i;
}